

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

TaprootBuilder * __thiscall TaprootBuilder::Finalize(TaprootBuilder *this,XOnlyPubKey *internal_key)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  pair<XOnlyPubKey,_bool> *__args;
  undefined8 *in_RSI;
  TaprootBuilder *in_RDI;
  long in_FS_OFFSET;
  optional<std::pair<XOnlyPubKey,_bool>_> ret;
  optional<TaprootBuilder::NodeInfo> *in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff90;
  TaprootBuilder *in_stack_ffffffffffffff98;
  pair<XOnlyPubKey,_bool> *__in;
  bool local_40 [8];
  uint256 *in_stack_ffffffffffffffc8;
  XOnlyPubKey *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsComplete(in_stack_ffffffffffffff98);
  if (!bVar2) {
    __assert_fail("IsComplete()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                  ,0x188,"TaprootBuilder &TaprootBuilder::Finalize(const XOnlyPubKey &)");
  }
  *(undefined8 *)(in_RDI->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems = *in_RSI;
  *(undefined8 *)((in_RDI->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8) =
       in_RSI[1];
  *(undefined8 *)((in_RDI->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10) =
       in_RSI[2];
  *(undefined8 *)((in_RDI->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18) =
       in_RSI[3];
  __in = (pair<XOnlyPubKey,_bool> *)&in_RDI->m_internal_key;
  sVar3 = std::
          vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
          ::size((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  *)in_stack_ffffffffffffff88);
  if (sVar3 != 0) {
    std::
    vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ::operator[]((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::optional<TaprootBuilder::NodeInfo>::operator->(in_stack_ffffffffffffff88);
  }
  XOnlyPubKey::CreateTapTweak(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  bVar2 = std::optional<std::pair<XOnlyPubKey,_bool>_>::has_value
                    ((optional<std::pair<XOnlyPubKey,_bool>_> *)in_stack_ffffffffffffff88);
  if (bVar2) {
    __args = std::optional<std::pair<XOnlyPubKey,_bool>_>::operator*
                       ((optional<std::pair<XOnlyPubKey,_bool>_> *)in_stack_ffffffffffffff88);
    std::tie<XOnlyPubKey,bool>(&__args->first,local_40);
    std::tuple<XOnlyPubKey&,bool&>::operator=((tuple<XOnlyPubKey_&,_bool_&> *)in_RDI,__in);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
      __stack_chk_fail();
    }
    return in_RDI;
  }
  __assert_fail("ret.has_value()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                ,0x18b,"TaprootBuilder &TaprootBuilder::Finalize(const XOnlyPubKey &)");
}

Assistant:

TaprootBuilder& TaprootBuilder::Finalize(const XOnlyPubKey& internal_key)
{
    /* Can only call this function when IsComplete() is true. */
    assert(IsComplete());
    m_internal_key = internal_key;
    auto ret = m_internal_key.CreateTapTweak(m_branch.size() == 0 ? nullptr : &m_branch[0]->hash);
    assert(ret.has_value());
    std::tie(m_output_key, m_parity) = *ret;
    return *this;
}